

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_step(sqlite3_stmt *pStmt)

{
  int *piVar1;
  long lVar2;
  byte bVar3;
  ushort uVar4;
  undefined2 uVar5;
  sqlite3 *psVar6;
  sqlite3 *db;
  u64 uVar7;
  Btree *p;
  Wal *pWVar8;
  uint *puVar9;
  long *plVar10;
  sqlite3_stmt sVar11;
  char cVar12;
  uint uVar13;
  int iVar14;
  undefined4 uVar15;
  long *plVar16;
  undefined8 *puVar17;
  size_t sVar18;
  char *pcVar19;
  byte *pbVar20;
  char *pcVar21;
  byte *pbVar22;
  sqlite3_stmt *psVar23;
  undefined8 uVar24;
  int iVar25;
  int iVar26;
  long lVar27;
  int iVar28;
  Mem *pMem;
  int iVar29;
  long lVar30;
  u32 uVar31;
  byte *unaff_R13;
  int iVar32;
  uint uVar33;
  ulong uVar34;
  bool bVar35;
  sqlite3_str local_98;
  Mem *local_78;
  int local_70;
  uint local_6c;
  int local_68;
  int local_64;
  sqlite3 *local_60;
  long local_58;
  sqlite3_stmt *local_50;
  byte *local_48;
  long local_40;
  sqlite3_stmt *local_38;
  
  if (pStmt == (sqlite3_stmt *)0x0) {
    pcVar19 = "API called with NULL prepared statement";
  }
  else {
    psVar6 = *(sqlite3 **)pStmt;
    if (psVar6 != (sqlite3 *)0x0) {
      if (psVar6->mutex != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexEnter)(psVar6->mutex);
      }
      local_50 = pStmt + 0xb8;
      local_38 = pStmt + 0x88;
      iVar32 = 0;
      local_60 = psVar6;
      do {
        psVar6 = *(sqlite3 **)pStmt;
        sVar11 = pStmt[199];
        local_64 = iVar32;
        if (sVar11 == (sqlite3_stmt)0x2) {
LAB_00119df4:
          if ((*(ushort *)(pStmt + 200) & 0xc) == 0) {
            psVar6->nVdbeExec = psVar6->nVdbeExec + 1;
            uVar13 = sqlite3VdbeExec((Vdbe *)pStmt);
            psVar6->nVdbeExec = psVar6->nVdbeExec + -1;
            uVar33 = uVar13;
            if (uVar13 == 100) {
LAB_0011a7d9:
              psVar6->errCode = 100;
              uVar13 = 100;
              goto LAB_0011a8b8;
            }
          }
          else {
            db = *(sqlite3 **)pStmt;
            local_58 = *(long *)(pStmt + 0x68);
            local_78 = (Mem *)(local_58 + 0x38);
            if ((*(ushort *)(pStmt + 200) & 0xc) == 4) {
              releaseMemArray(local_78,8);
              if (*(int *)(pStmt + 0x34) == 7) {
LAB_00119e7d:
                sqlite3OomFault(db);
LAB_00119e87:
                uVar13 = 1;
                uVar33 = 1;
                goto LAB_0011a093;
              }
LAB_00119eae:
              lVar27 = *(long *)(pStmt + 0x68);
              pMem = (Mem *)(lVar27 + 0x1f8);
              uVar4 = *(ushort *)(pStmt + 200);
              iVar32 = *(int *)(pStmt + 0x90);
              if ((*(byte *)(lVar27 + 0x20c) & 0x10) == 0) {
                pbVar22 = (byte *)0x0;
                goto LAB_00119ed4;
              }
              uVar13 = *(int *)(lVar27 + 0x208) >> 3;
              unaff_R13 = (byte *)(ulong)uVar13;
              plVar16 = *(long **)(lVar27 + 0x200);
              if (0 < (int)uVar13) {
                pbVar22 = (byte *)0x0;
                do {
                  iVar32 = iVar32 + *(int *)(plVar16[(long)pbVar22] + 8);
                  pbVar22 = pbVar22 + 1;
                } while (unaff_R13 != pbVar22);
              }
              pbVar22 = (byte *)0x0;
            }
            else {
              uVar7 = db->flags;
              releaseMemArray(local_78,8);
              if (*(int *)(pStmt + 0x34) == 7) goto LAB_00119e7d;
              if (((uint)uVar7 >> 0x18 & 1) != 0) goto LAB_00119eae;
              uVar4 = *(ushort *)(pStmt + 200);
              iVar32 = *(int *)(pStmt + 0x90);
              pMem = (Mem *)0x0;
              pbVar22 = (byte *)CONCAT71((int7)((ulong)unaff_R13 >> 8),1);
LAB_00119ed4:
              unaff_R13 = (byte *)0x0;
              plVar16 = (long *)0x0;
            }
            iVar25 = *(int *)(pStmt + 0x30);
            iVar14 = iVar25 + 1;
            if (iVar25 < iVar32) {
              local_6c = uVar4 & 0xc;
              local_70 = iVar14;
              local_48 = pbVar22;
              uVar13 = local_6c;
LAB_00119f2c:
              iVar26 = iVar14;
              iVar29 = iVar25 - *(int *)(pStmt + 0x90);
              psVar23 = local_38;
              iVar14 = iVar25;
              if (*(int *)(pStmt + 0x90) <= iVar25) {
                psVar23 = (sqlite3_stmt *)*plVar16;
                iVar28 = *(int *)(psVar23 + 8);
                iVar14 = iVar29;
                plVar10 = plVar16;
                if (iVar28 <= iVar29) {
                  do {
                    iVar29 = iVar29 - iVar28;
                    psVar23 = (sqlite3_stmt *)plVar10[1];
                    iVar28 = *(int *)(psVar23 + 8);
                    iVar14 = iVar29;
                    plVar10 = plVar10 + 1;
                  } while (iVar28 <= iVar29);
                }
              }
              lVar27 = *(long *)psVar23;
              lVar30 = (long)iVar14;
              if (((char)pbVar22 == '\0') && (*(char *)(lVar27 + 1 + lVar30 * 0x18) == -4)) {
                lVar2 = lVar27 + lVar30 * 0x18;
                iVar14 = (int)unaff_R13;
                if (iVar14 < 1) {
                  pbVar20 = (byte *)0x0;
LAB_00119fb2:
                  if ((int)pbVar20 != iVar14) goto LAB_0011a044;
                }
                else {
                  pbVar20 = (byte *)0x0;
                  do {
                    if (plVar16[(long)pbVar20] == *(long *)(lVar2 + 0x10)) goto LAB_00119fb2;
                    pbVar20 = pbVar20 + 1;
                  } while (unaff_R13 != pbVar20);
                }
                local_68 = iVar14 * 8 + 8;
                local_40 = lVar2;
                iVar29 = sqlite3VdbeMemGrow(pMem,local_68,(uint)(iVar14 != 0));
                *(int *)(pStmt + 0x34) = iVar29;
                if (iVar29 != 0) {
                  uVar33 = 1;
                  uVar13 = 1;
                  goto LAB_0011a08a;
                }
                plVar16 = (long *)pMem->z;
                unaff_R13 = (byte *)(ulong)(iVar14 + 1);
                plVar16[iVar14] = *(long *)(local_40 + 0x10);
                uVar5 = pMem->flags;
                pMem->flags = uVar5 & 0xf240 | 0x10;
                pMem->n = local_68;
                iVar32 = iVar32 + *(int *)(*(long *)(local_40 + 0x10) + 8);
                pbVar22 = local_48;
                uVar13 = local_6c;
              }
LAB_0011a044:
              iVar14 = local_70;
              if ((((short)uVar13 == 8) &&
                  (cVar12 = *(char *)(lVar27 + lVar30 * 0x18), iVar14 = iVar26, cVar12 != -0x44)) &&
                 ((iVar25 < 1 || (cVar12 != '\b')))) goto LAB_0011a06e;
              *(int *)(pStmt + 0x30) = iVar14;
              if ((db->u1).isInterrupted != 0) {
                *(undefined4 *)(pStmt + 0x34) = 9;
                sqlite3VdbeError((Vdbe *)pStmt,"interrupted");
                unaff_R13 = pbVar22;
                goto LAB_00119e87;
              }
              unaff_R13 = (byte *)(lVar27 + lVar30 * 0x18);
              local_98.db = (sqlite3 *)0x0;
              local_98.zText = (char *)0x0;
              local_98.nAlloc = 0;
              local_98.mxAlloc = 1000000000;
              local_98.nChar = 0;
              local_98.accError = '\0';
              local_98.printfFlags = '\0';
              pcVar19 = "program";
              switch(unaff_R13[1]) {
              case 0xf1:
                pcVar19 = *(char **)(*(long *)(unaff_R13 + 0x10) + 8);
                goto LAB_0011a532;
              case 0xf2:
                puVar9 = *(uint **)(unaff_R13 + 0x10);
                uVar13 = *puVar9;
                if (uVar13 == 0) goto LAB_0011a552;
                uVar33 = 1;
                do {
                  uVar24 = 0x2c;
                  if (uVar33 == 1) {
                    uVar24 = 0x5b;
                  }
                  sqlite3_str_appendf(&local_98,"%c%u",uVar24,(ulong)puVar9[uVar33]);
                  uVar33 = uVar33 + 1;
                } while (uVar33 <= uVar13);
                if (local_98.nChar + 1 < local_98.nAlloc) {
                  local_98.zText[local_98.nChar] = ']';
                  local_98.nChar = local_98.nChar + 1;
                }
                else {
LAB_0011a552:
                  enlargeAndAppend(&local_98,"]",1);
                }
                break;
              case 0xf3:
                puVar17 = *(undefined8 **)(unaff_R13 + 0x10);
                goto LAB_0011a4f1;
              case 0xf4:
                puVar17 = *(undefined8 **)(unaff_R13 + 0x10);
LAB_0011a50e:
                sqlite3_str_appendf(&local_98,"%.16g",(int)*puVar17);
                break;
              case 0xf5:
                uVar24 = *(undefined8 *)(*(long *)(unaff_R13 + 0x10) + 0x10);
                pcVar19 = "vtab:%p";
                goto LAB_0011a4fe;
              case 0xf6:
                puVar17 = *(undefined8 **)(unaff_R13 + 0x10);
                uVar4 = *(ushort *)((long)puVar17 + 0x14);
                if ((uVar4 & 2) != 0) {
                  pbVar22 = (byte *)(puVar17 + 1);
                  goto LAB_0011a56c;
                }
                if ((uVar4 & 0x24) == 0) {
                  if ((uVar4 & 8) == 0) {
                    pcVar19 = "NULL";
                    if ((uVar4 & 1) == 0) {
                      pcVar19 = "(blob)";
                    }
                    goto switchD_0011a2ed_caseD_fc;
                  }
                  goto LAB_0011a50e;
                }
LAB_0011a4f1:
                uVar24 = *puVar17;
                pcVar19 = "%lld";
LAB_0011a4fe:
                sqlite3_str_appendf(&local_98,pcVar19,uVar24);
                break;
              default:
                pbVar22 = unaff_R13 + 0x10;
                goto LAB_0011a56c;
              case 0xf8:
                lVar27 = *(long *)(unaff_R13 + 0x10);
                sqlite3_str_appendf(&local_98,"k(%d",(ulong)*(ushort *)(lVar27 + 6));
                if (*(short *)(lVar27 + 6) != 0) {
                  uVar34 = 0;
                  do {
                    puVar17 = *(undefined8 **)(lVar27 + 0x20 + uVar34 * 8);
                    pcVar19 = "";
                    if (puVar17 != (undefined8 *)0x0) {
                      pcVar19 = (char *)*puVar17;
                    }
                    strcmp(pcVar19,"BINARY");
                    bVar3 = *(byte *)(*(long *)(lVar27 + 0x18) + uVar34);
                    pcVar19 = "-";
                    if ((bVar3 & 1) == 0) {
                      pcVar19 = "";
                    }
                    pcVar21 = "N.";
                    if ((bVar3 & 2) == 0) {
                      pcVar21 = "";
                    }
                    sqlite3_str_appendf(&local_98,",%s%s%s",pcVar19,pcVar21);
                    uVar34 = uVar34 + 1;
                  } while (uVar34 < *(ushort *)(lVar27 + 6));
                }
                if (local_98.nChar + 1 < local_98.nAlloc) {
                  local_98.zText[local_98.nChar] = ')';
                  local_98.nChar = local_98.nChar + 1;
                }
                else {
                  enlargeAndAppend(&local_98,")",1);
                }
                break;
              case 0xf9:
                pcVar19 = *(char **)(unaff_R13 + 0x10);
LAB_0011a532:
                sqlite3_str_appendf(&local_98,"%s(%d)",*(undefined8 *)(pcVar19 + 0x38),
                                    (ulong)(uint)(int)*pcVar19);
                break;
              case 0xfb:
                pbVar22 = *(byte **)(unaff_R13 + 0x10);
LAB_0011a56c:
                pcVar19 = *(char **)pbVar22;
                if (pcVar19 != (char *)0x0) {
switchD_0011a2ed_caseD_fc:
                  sVar18 = strlen(pcVar19);
                  sqlite3_str_append(&local_98,pcVar19,(uint)sVar18 & 0x3fffffff);
                }
                break;
              case 0xfc:
                goto switchD_0011a2ed_caseD_fc;
              case 0xfd:
                sqlite3_str_appendf(&local_98,"%d",(ulong)*(uint *)(unaff_R13 + 0x10));
                break;
              case 0xfe:
                sqlite3_str_appendf(&local_98,"%.18s-%s",**(undefined8 **)(unaff_R13 + 0x10),
                                    sqlite3VdbeDisplayP4_encnames_rel +
                                    *(int *)(sqlite3VdbeDisplayP4_encnames_rel +
                                            (ulong)*(byte *)(*(undefined8 **)(unaff_R13 + 0x10) + 1)
                                            * 4));
              }
              if ((local_98._28_2_ & 7) != 0) {
                sqlite3OomFault(db);
              }
              pcVar19 = sqlite3StrAccumFinish(&local_98);
              lVar27 = local_58;
              if ((*(ushort *)(pStmt + 200) & 0xc) == 8) {
                if ((*(byte *)(local_58 + 0x4d) & 0x90) == 0) {
                  *(long *)(local_58 + 0x38) = (long)*(int *)(unaff_R13 + 4);
                  *(undefined2 *)(local_58 + 0x4c) = 4;
                }
                else {
                  vdbeReleaseAndSetInt64(local_78,(long)*(int *)(unaff_R13 + 4));
                }
                if ((*(byte *)(lVar27 + 0x85) & 0x90) == 0) {
                  *(long *)(lVar27 + 0x70) = (long)*(int *)(unaff_R13 + 8);
                  *(undefined2 *)(lVar27 + 0x84) = 4;
                }
                else {
                  vdbeReleaseAndSetInt64((Mem *)(lVar27 + 0x70),(long)*(int *)(unaff_R13 + 8));
                }
                if ((*(byte *)(lVar27 + 0xbd) & 0x90) == 0) {
                  *(long *)(lVar27 + 0xa8) = (long)*(int *)(unaff_R13 + 0xc);
                  *(undefined2 *)(lVar27 + 0xbc) = 4;
                }
                else {
                  vdbeReleaseAndSetInt64((Mem *)(lVar27 + 0xa8),(long)*(int *)(unaff_R13 + 0xc));
                }
                lVar30 = 0xe0;
              }
              else {
                if ((*(byte *)(local_58 + 0x4d) & 0x90) == 0) {
                  *(long *)(local_58 + 0x38) = lVar30;
                  *(undefined2 *)(local_58 + 0x4c) = 4;
                }
                else {
                  vdbeReleaseAndSetInt64(local_78,lVar30);
                }
                sqlite3VdbeMemSetStr
                          ((Mem *)(lVar27 + 0x70),
                           sqlite3OpcodeName_azName_rel +
                           *(int *)(sqlite3OpcodeName_azName_rel + (ulong)*unaff_R13 * 4),-1,'\x01',
                           (_func_void_void_ptr *)0x0);
                if ((*(byte *)(lVar27 + 0xbd) & 0x90) == 0) {
                  *(long *)(lVar27 + 0xa8) = (long)*(int *)(unaff_R13 + 4);
                  *(undefined2 *)(lVar27 + 0xbc) = 4;
                }
                else {
                  vdbeReleaseAndSetInt64((Mem *)(lVar27 + 0xa8),(long)*(int *)(unaff_R13 + 4));
                }
                if ((*(byte *)(lVar27 + 0xf5) & 0x90) == 0) {
                  *(long *)(lVar27 + 0xe0) = (long)*(int *)(unaff_R13 + 8);
                  *(undefined2 *)(lVar27 + 0xf4) = 4;
                }
                else {
                  vdbeReleaseAndSetInt64((Mem *)(lVar27 + 0xe0),(long)*(int *)(unaff_R13 + 8));
                }
                if ((*(byte *)(lVar27 + 0x12d) & 0x90) == 0) {
                  *(long *)(lVar27 + 0x118) = (long)*(int *)(unaff_R13 + 0xc);
                  *(undefined2 *)(lVar27 + 300) = 4;
                }
                else {
                  vdbeReleaseAndSetInt64((Mem *)(lVar27 + 0x118),(long)*(int *)(unaff_R13 + 0xc));
                }
                if ((*(byte *)(lVar27 + 0x19d) & 0x90) == 0) {
                  *(ulong *)(lVar27 + 0x188) = (ulong)*(ushort *)(unaff_R13 + 2);
                  *(undefined2 *)(lVar27 + 0x19c) = 4;
                }
                else {
                  vdbeReleaseAndSetInt64((Mem *)(lVar27 + 0x188),(ulong)*(ushort *)(unaff_R13 + 2));
                }
                if ((*(byte *)(lVar27 + 0x1d5) & 0x90) == 0) {
                  *(undefined2 *)(lVar27 + 0x1d4) = 1;
                }
                else {
                  vdbeMemClearExternAndSetNull((Mem *)(lVar27 + 0x1c0));
                }
                lVar30 = 0x150;
              }
              uVar13 = 1;
              sqlite3VdbeMemSetStr((Mem *)(lVar27 + lVar30),pcVar19,-1,'\x01',sqlite3_free);
              *(Mem **)(pStmt + 0xa0) = local_78;
              bVar35 = db->mallocFailed == '\0';
              uVar15 = 7;
              if (bVar35) {
                uVar15 = 0;
              }
              *(undefined4 *)(pStmt + 0x34) = uVar15;
              uVar33 = 1;
              if (bVar35) goto LAB_0011a7d9;
              goto LAB_0011a093;
            }
LAB_0011a07a:
            unaff_R13 = pbVar22;
            *(undefined4 *)(pStmt + 0x34) = 0;
            uVar33 = 0x65;
            uVar13 = 0x65;
            iVar26 = iVar14;
LAB_0011a08a:
            *(int *)(pStmt + 0x30) = iVar26;
          }
LAB_0011a093:
          if (0 < *(long *)local_50) {
            invokeProfileCallback(psVar6,(Vdbe *)pStmt);
          }
          *(undefined8 *)(pStmt + 0xa0) = 0;
          if (uVar13 == 0x65) {
            uVar13 = 0x65;
            uVar33 = 0x65;
            if (psVar6->autoCommit != '\0') {
              if (psVar6->nDb < 1) {
                *(undefined4 *)(pStmt + 0x34) = 0;
              }
              else {
                unaff_R13 = (byte *)0x0;
                lVar27 = 0;
                iVar32 = 0;
                do {
                  p = *(Btree **)((long)&psVar6->aDb->pBt + (long)unaff_R13);
                  if (p != (Btree *)0x0) {
                    if ((p->sharable != '\0') &&
                       (p->wantToLock = p->wantToLock + 1, p->locked == '\0')) {
                      btreeLockCarefully(p);
                    }
                    pWVar8 = p->pBt->pPager->pWal;
                    if (pWVar8 == (Wal *)0x0) {
                      uVar31 = 0;
                    }
                    else {
                      uVar31 = pWVar8->iCallback;
                      pWVar8->iCallback = 0;
                    }
                    if (p->sharable != '\0') {
                      piVar1 = &p->wantToLock;
                      *piVar1 = *piVar1 + -1;
                      if (*piVar1 == 0) {
                        unlockBtreeMutex(p);
                      }
                    }
                    if (((0 < (int)uVar31) &&
                        (psVar6->xWalCallback != (_func_int_void_ptr_sqlite3_ptr_char_ptr_int *)0x0)
                        ) && (iVar32 == 0)) {
                      iVar32 = (*psVar6->xWalCallback)
                                         (psVar6->pWalArg,psVar6,
                                          *(char **)(unaff_R13 + (long)&psVar6->aDb->zDbSName),
                                          uVar31);
                    }
                  }
                  lVar27 = lVar27 + 1;
                  unaff_R13 = unaff_R13 + 0x20;
                } while (lVar27 < psVar6->nDb);
                *(int *)(pStmt + 0x34) = iVar32;
                uVar13 = 1;
                uVar33 = 1;
                if (iVar32 != 0) goto LAB_0011a1cc;
              }
              uVar13 = 0x65;
              uVar33 = 0x65;
            }
          }
          else if ((char)pStmt[0xc6] < '\0') {
            uVar13 = sqlite3VdbeTransferError((Vdbe *)pStmt);
            uVar33 = uVar13;
          }
LAB_0011a1cc:
          psVar6->errCode = uVar13;
          if (((*(int *)(pStmt + 0x34) != 0) || ((*(sqlite3 **)pStmt)->mallocFailed != '\0')) &&
             ((iVar32 = apiHandleError(*(sqlite3 **)pStmt,*(int *)(pStmt + 0x34)), iVar32 == 7 &&
              (*(undefined4 *)(pStmt + 0x34) = 7, uVar13 = uVar33, (char)pStmt[0xc6] < '\0')))) {
            uVar13 = 7;
          }
        }
        else {
          while (sVar11 == (sqlite3_stmt)0x3) {
            sqlite3_reset(pStmt);
            sVar11 = pStmt[199];
          }
          if (sVar11 != (sqlite3_stmt)0x1) goto LAB_00119df4;
          if (((byte)pStmt[200] & 3) == 0) {
            iVar32 = psVar6->nVdbeActive;
            if (iVar32 == 0) {
              (psVar6->u1).isInterrupted = 0;
            }
            if ((((psVar6->mTrace & 0x82) != 0) && ((psVar6->init).busy == '\0')) &&
               (*(long *)(pStmt + 0xf8) != 0)) {
              sqlite3OsCurrentTimeInt64(psVar6->pVfs,(sqlite3_int64 *)local_50);
              iVar32 = psVar6->nVdbeActive;
            }
            psVar6->nVdbeActive = iVar32 + 1;
            cVar12 = (char)*(ushort *)(pStmt + 200);
            if ((*(ushort *)(pStmt + 200) & 0x40) == 0) {
              psVar6->nVdbeWrite = psVar6->nVdbeWrite + 1;
              cVar12 = (char)*(undefined2 *)(pStmt + 200);
            }
            if (cVar12 < '\0') {
              psVar6->nVdbeRead = psVar6->nVdbeRead + 1;
            }
            *(undefined4 *)(pStmt + 0x30) = 0;
            pStmt[199] = (sqlite3_stmt)0x2;
            goto LAB_00119df4;
          }
          *(undefined4 *)(pStmt + 0x34) = 0x11;
          uVar13 = 1;
          if ((char)pStmt[0xc6] < '\0') {
            uVar13 = sqlite3VdbeTransferError((Vdbe *)pStmt);
          }
        }
        iVar32 = local_64;
        uVar13 = uVar13 & psVar6->errMask;
        if (uVar13 != 0x11) goto LAB_0011a8b8;
        if (local_64 == 0x32) {
          uVar13 = 0x11;
          goto LAB_0011a8b8;
        }
        iVar25 = *(int *)(pStmt + 0x30);
        iVar14 = sqlite3Reprepare((Vdbe *)pStmt);
        psVar6 = local_60;
        if (iVar14 != 0) {
          pcVar19 = (char *)sqlite3ValueText(local_60->pErr,'\x01');
          if (*(void **)(pStmt + 0xa8) != (void *)0x0) {
            sqlite3DbFreeNN(psVar6,*(void **)(pStmt + 0xa8));
          }
          if (psVar6->mallocFailed == '\0') {
            pcVar19 = sqlite3DbStrDup(psVar6,pcVar19);
            *(char **)(pStmt + 0xa8) = pcVar19;
            uVar13 = apiHandleError(psVar6,iVar14);
            *(uint *)(pStmt + 0x34) = uVar13;
          }
          else {
            *(undefined8 *)(pStmt + 0xa8) = 0;
            *(undefined4 *)(pStmt + 0x34) = 7;
            uVar13 = 7;
          }
LAB_0011a8b8:
          if (local_60->mutex == (sqlite3_mutex *)0x0) {
            return uVar13;
          }
          (*sqlite3Config.mutex.xMutexLeave)(local_60->mutex);
          return uVar13;
        }
        iVar32 = iVar32 + 1;
        sqlite3_reset(pStmt);
        if (-1 < iVar25) {
          pStmt[0xc5] = (sqlite3_stmt)0xfe;
        }
      } while( true );
    }
    pcVar19 = "API called with finalized prepared statement";
  }
  sqlite3_log(0x15,pcVar19);
  sqlite3_log(0x15,"%s at line %d of [%.10s]","misuse",0x1648f,
              "c9c2ab54ba1f5f46360f1b4f35d849cd3f080e6fc2b6c60e91b16c63f69a1e33");
  return 0x15;
LAB_0011a06e:
  iVar14 = iVar26 + 1;
  iVar25 = iVar26;
  if (iVar32 <= iVar26) goto LAB_0011a07a;
  goto LAB_00119f2c;
}

Assistant:

SQLITE_API int sqlite3_step(sqlite3_stmt *pStmt){
  int rc = SQLITE_OK;      /* Result from sqlite3Step() */
  Vdbe *v = (Vdbe*)pStmt;  /* the prepared statement */
  int cnt = 0;             /* Counter to prevent infinite loop of reprepares */
  sqlite3 *db;             /* The database connection */

  if( vdbeSafetyNotNull(v) ){
    return SQLITE_MISUSE_BKPT;
  }
  db = v->db;
  sqlite3_mutex_enter(db->mutex);
  while( (rc = sqlite3Step(v))==SQLITE_SCHEMA
         && cnt++ < SQLITE_MAX_SCHEMA_RETRY ){
    int savedPc = v->pc;
    rc = sqlite3Reprepare(v);
    if( rc!=SQLITE_OK ){
      /* This case occurs after failing to recompile an sql statement.
      ** The error message from the SQL compiler has already been loaded
      ** into the database handle. This block copies the error message
      ** from the database handle into the statement and sets the statement
      ** program counter to 0 to ensure that when the statement is
      ** finalized or reset the parser error message is available via
      ** sqlite3_errmsg() and sqlite3_errcode().
      */
      const char *zErr = (const char *)sqlite3_value_text(db->pErr);
      sqlite3DbFree(db, v->zErrMsg);
      if( !db->mallocFailed ){
        v->zErrMsg = sqlite3DbStrDup(db, zErr);
        v->rc = rc = sqlite3ApiExit(db, rc);
      } else {
        v->zErrMsg = 0;
        v->rc = rc = SQLITE_NOMEM_BKPT;
      }
      break;
    }
    sqlite3_reset(pStmt);
    if( savedPc>=0 ){
      /* Setting minWriteFileFormat to 254 is a signal to the OP_Init and
      ** OP_Trace opcodes to *not* perform SQLITE_TRACE_STMT because it has
      ** already been done once on a prior invocation that failed due to
      ** SQLITE_SCHEMA.   tag-20220401a  */
      v->minWriteFileFormat = 254;
    }
    assert( v->expired==0 );
  }
  sqlite3_mutex_leave(db->mutex);
  return rc;
}